

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

uint32_t gguf_get_val_u32(gguf_context *ctx,int64_t key_id)

{
  int64_t iVar1;
  size_t sVar2;
  uint *puVar3;
  size_type in_RSI;
  size_t in_RDI;
  gguf_kv *unaff_retaddr;
  
  if (-1 < (long)in_RSI) {
    iVar1 = gguf_get_n_kv((gguf_context *)0x18ed59);
    if ((long)in_RSI < iVar1) {
      std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      sVar2 = gguf_kv::get_ne((gguf_kv *)key_id);
      if (sVar2 != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                   ,0x33c,"GGML_ASSERT(%s) failed","ctx->kv[key_id].get_ne() == 1");
      }
      std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      puVar3 = gguf_kv::get_val<unsigned_int>(unaff_retaddr,in_RDI);
      return *puVar3;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,0x33b,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)");
}

Assistant:

uint32_t gguf_get_val_u32(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_ne() == 1);
    return ctx->kv[key_id].get_val<uint32_t>();
}